

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int exprSrcCount(Walker *pWalker,Expr *pExpr)

{
  SrcCount *pSVar1;
  long lVar2;
  long lVar3;
  
  if ((pExpr->op | 2) == 0x9a) {
    pSVar1 = (pWalker->u).pSrcCount;
    lVar2 = (long)pSVar1->pSrc->nSrc;
    if (0 < lVar2) {
      lVar3 = 0;
      do {
        if (pExpr->iTable == *(int *)((long)&pSVar1->pSrc->a[0].iCursor + lVar3)) {
          pSVar1->nThis = pSVar1->nThis + 1;
          return 0;
        }
        lVar3 = lVar3 + 0x68;
      } while (lVar2 * 0x68 - lVar3 != 0);
    }
    pSVar1->nOther = pSVar1->nOther + 1;
  }
  return 0;
}

Assistant:

static int exprSrcCount(Walker *pWalker, Expr *pExpr){
  /* The NEVER() on the second term is because sqlite3FunctionUsesThisSrc()
  ** is always called before sqlite3ExprAnalyzeAggregates() and so the
  ** TK_COLUMNs have not yet been converted into TK_AGG_COLUMN.  If
  ** sqlite3FunctionUsesThisSrc() is used differently in the future, the
  ** NEVER() will need to be removed. */
  if( pExpr->op==TK_COLUMN || NEVER(pExpr->op==TK_AGG_COLUMN) ){
    int i;
    struct SrcCount *p = pWalker->u.pSrcCount;
    SrcList *pSrc = p->pSrc;
    for(i=0; i<pSrc->nSrc; i++){
      if( pExpr->iTable==pSrc->a[i].iCursor ) break;
    }
    if( i<pSrc->nSrc ){
      p->nThis++;
    }else{
      p->nOther++;
    }
  }
  return WRC_Continue;
}